

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall
QCss::ValueExtractor::extractOutline
          (ValueExtractor *this,int *borders,QBrush *colors,BorderStyle *styles,QSize *radii,
          int *offsets)

{
  Property PVar1;
  int iVar2;
  BorderStyle BVar3;
  Declaration *pDVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  QBrush *pQVar8;
  QSize QVar9;
  long lVar10;
  int *m;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  int dummy;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fontExtracted == 0) {
    local_3c = -0xff;
    extractFont(this,&this->f,&local_3c);
  }
  if ((this->declarations).d.size == 0) {
    bVar7 = false;
  }
  else {
    uVar11 = 0;
    bVar7 = false;
    do {
      pDVar4 = (this->declarations).d.ptr;
      PVar1 = (pDVar4[uVar11].d.d.ptr)->propertyId;
      if (9 < PVar1 - Outline) goto LAB_005da6d6;
      pDVar4 = pDVar4 + uVar11;
      switch(PVar1) {
      case Outline:
        borderValue(this,pDVar4,borders + 3,styles + 3,colors + 3);
        iVar2 = borders[3];
        borders[2] = iVar2;
        borders[1] = iVar2;
        *borders = iVar2;
        BVar3 = styles[3];
        styles[2] = BVar3;
        styles[1] = BVar3;
        *styles = BVar3;
        pQVar8 = QBrush::operator=(colors + 2,colors + 3);
        pQVar8 = QBrush::operator=(colors + 1,pQVar8);
        QBrush::operator=(colors,pQVar8);
        break;
      case OutlineOffset:
        m = offsets;
        goto LAB_005da636;
      case OutlineWidth:
        m = borders;
LAB_005da636:
        lengthValues(this,pDVar4,m);
        break;
      case OutlineColor:
        Declaration::brushValues(pDVar4,colors,&this->pal);
        break;
      case OutlineStyle:
        Declaration::styleValues(pDVar4,styles);
        break;
      case OutlineRadius:
        QVar9 = sizeValue(this,pDVar4);
        *radii = QVar9;
        auVar6 = _DAT_00674850;
        auVar5 = _DAT_00674840;
        lVar10 = 0;
        do {
          auVar12._8_4_ = (int)lVar10;
          auVar12._0_8_ = lVar10;
          auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar12 = (auVar12 | auVar5) ^ auVar6;
          if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7ffffffd) {
            radii[lVar10 + 1] = QVar9;
            radii[lVar10 + 2] = QVar9;
          }
          lVar10 = lVar10 + 2;
        } while (lVar10 != 4);
        break;
      case OutlineTopLeftRadius:
        QVar9 = sizeValue(this,pDVar4);
        *radii = QVar9;
        break;
      case OutlineTopRightRadius:
        QVar9 = sizeValue(this,pDVar4);
        radii[1] = QVar9;
        break;
      case OutlineBottomLeftRadius:
        QVar9 = sizeValue(this,pDVar4);
        radii[2] = QVar9;
        break;
      case OutlineBottomRightRadius:
        QVar9 = sizeValue(this,pDVar4);
        radii[3] = QVar9;
      }
      bVar7 = true;
LAB_005da6d6:
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool ValueExtractor::extractOutline(int *borders, QBrush *colors, BorderStyle *styles,
                                   QSize *radii, int *offsets)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case OutlineWidth: lengthValues(decl, borders); break;
        case OutlineColor: decl.brushValues(colors, pal); break;
        case OutlineStyle:  decl.styleValues(styles); break;

        case OutlineTopLeftRadius: radii[0] = sizeValue(decl); break;
        case OutlineTopRightRadius: radii[1] = sizeValue(decl); break;
        case OutlineBottomLeftRadius: radii[2] = sizeValue(decl); break;
        case OutlineBottomRightRadius: radii[3] = sizeValue(decl); break;
        case OutlineRadius: sizeValues(decl, radii); break;
        case OutlineOffset: lengthValues(decl, offsets); break;

        case Outline:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            borders[TopEdge] = borders[RightEdge] = borders[BottomEdge] = borders[LeftEdge];
            styles[TopEdge] = styles[RightEdge] = styles[BottomEdge] = styles[LeftEdge];
            colors[TopEdge] = colors[RightEdge] = colors[BottomEdge] = colors[LeftEdge];
            break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}